

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator-
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this)

{
  VectorXd c;
  vectype local_48;
  DenseStorage<double,__1,__1,_1,_0> local_38;
  DenseStorage<double,__1,__1,_1,_0> *local_28 [2];
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_38,(DenseStorage<double,__1,__1,_1,_0> *)this);
  local_28[0] = &local_38;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_48,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_28);
  ChebyshevExpansion(__return_storage_ptr__,&local_48,this->m_xmin,this->m_xmax);
  free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_38.m_data);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::operator-() const{
        Eigen::VectorXd c = m_c;
        return ChebyshevExpansion(-c, m_xmin, m_xmax);
    }